

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_insert.c
# Opt level: O1

void * mpt_buffer_insert(mpt_buffer *buf,size_t pos,size_t len)

{
  mpt_type_traits *pmVar1;
  uint32_t uVar2;
  int iVar3;
  int *piVar4;
  _func_int_void_ptr_void_ptr *p_Var5;
  size_t __n;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_38;
  
  uVar8 = buf->_used;
  sVar6 = pos;
  if (pos <= uVar8 && uVar8 - pos != 0) {
    sVar6 = uVar8;
  }
  __n = 0;
  if (pos <= uVar8) {
    __n = uVar8 - pos;
  }
  uVar7 = sVar6 + len;
  if (uVar7 == 0) {
    return buf + 1;
  }
  if (buf->_size < uVar7) {
LAB_0010a0fd:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return (void *)0x0;
  }
  uVar2 = (*buf->_vptr->get_flags)(buf);
  if ((uVar2 & 1) != 0) {
    piVar4 = __errno_location();
    *piVar4 = 0x5f;
    return (void *)0x0;
  }
  pmVar1 = buf->_content_traits;
  if (pmVar1 == (mpt_type_traits *)0x0) {
    p_Var5 = (_func_int_void_ptr_void_ptr *)0x0;
    local_38 = 0;
  }
  else {
    local_38 = pmVar1->size;
    if ((((local_38 == 0) || (uVar8 % local_38 != 0)) || (pos % local_38 != 0)) ||
       (len % local_38 != 0)) goto LAB_0010a0fd;
    p_Var5 = pmVar1->init;
  }
  buf->_used = uVar7;
  if (pos < uVar8) {
    memmove((void *)((long)buf + ((uVar7 + 0x20) - __n)),(void *)((long)&buf[1]._vptr + pos),__n);
  }
  if (uVar8 < pos && p_Var5 != (_func_int_void_ptr_void_ptr *)0x0) {
    do {
      iVar3 = (*p_Var5)((void *)((long)&buf[1]._vptr + uVar8),(void *)0x0);
      if (iVar3 < 0) break;
      uVar8 = uVar8 + local_38;
    } while (uVar8 < pos);
  }
  if (uVar8 <= pos && pos - uVar8 != 0) {
    memset((void *)((long)&buf[1]._vptr + uVar8),0,pos - uVar8);
  }
  return (void *)((long)&buf[1]._vptr + pos);
}

Assistant:

extern void *mpt_buffer_insert(MPT_STRUCT(buffer) *buf, size_t pos, size_t len)
{
	const MPT_STRUCT(type_traits) *traits;
	int (*init)(void *, const void *);
	uint8_t *base;
	size_t used, total, size, keep;
	
	/* need memory for inserted and existing data */
	used = buf->_used;
	if (pos < used) {
		total = used + len;
		keep = used - pos;
	} else {
		total = pos + len;
		keep = 0;
	}
	if (!total) {
		return buf + 1;
	}
	if (total > buf->_size) {
		errno = EINVAL;
		return 0;
	}
	if (MPT_ENUM(BufferImmutable) & buf->_vptr->get_flags(buf)) {
		errno = ENOTSUP;
		return 0;
	}
	/* require aligned values */
	size = 0;
	init = 0;
	if ((traits = buf->_content_traits)) {
		if (!(size = traits->size)
		    || used % size
		    || pos % size
		    || len % size) {
			errno = EINVAL;
			return 0;
		}
		init = traits->init;
	}
	base = (uint8_t *) (buf + 1);
	buf->_used = total;
	
	/* move data after insert position */
	if (keep) {
		memmove(base + total - keep, base + pos, keep);
	}
	/* init all new data */
	if (init) {
		while (used < pos) {
			if (init(base + used, 0) < 0) {
				break;
			}
			used += size;
		}
	}
	/* fill preceeding data */
	if (pos > used) {
		memset(base + used, 0, pos - used);
	}
	return base + pos;
}